

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

uint16_t * GetCostModeI4(VP8EncIterator *it,uint8_t *modes)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  uint8_t *puVar5;
  
  iVar1 = it->enc->preds_w;
  uVar2 = it->i4;
  puVar5 = modes;
  uVar4 = uVar2;
  if ((uVar2 & 3) == 0) {
    puVar5 = it->preds;
    uVar4 = ((int)uVar2 >> 2) * iVar1;
  }
  if (uVar2 < 4) {
    pbVar3 = it->preds + (int)((uVar2 & 3) - iVar1);
  }
  else {
    pbVar3 = modes + (long)(int)uVar2 + -4;
  }
  return VP8FixedCostsI4[*pbVar3][puVar5[(long)(int)uVar4 + -1]];
}

Assistant:

static const uint16_t* GetCostModeI4(VP8EncIterator* WEBP_RESTRICT const it,
                                     const uint8_t modes[16]) {
  const int preds_w = it->enc->preds_w;
  const int x = (it->i4 & 3), y = it->i4 >> 2;
  const int left = (x == 0) ? it->preds[y * preds_w - 1] : modes[it->i4 - 1];
  const int top = (y == 0) ? it->preds[-preds_w + x] : modes[it->i4 - 4];
  return VP8FixedCostsI4[top][left];
}